

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O3

double nivalis::detail::eval_ast
                 (Environment *env,AST *ast,vector<double,_std::allocator<double>_> *arg_vals)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  pointer pAVar5;
  pointer pUVar6;
  iterator iVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  uint64_t uVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  pointer pdVar14;
  long lVar15;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar16;
  lanczos17m64 *t;
  double *pdVar17;
  long lVar18;
  long lVar19;
  unsigned_long uVar20;
  ulong uVar21;
  uint uVar22;
  pointer pAVar23;
  long lVar24;
  long *in_FS_OFFSET;
  longdouble in_ST0;
  longdouble lVar25;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar26;
  longdouble in_ST3;
  longdouble lVar27;
  longdouble in_ST4;
  longdouble lVar28;
  longdouble in_ST5;
  longdouble lVar29;
  longdouble in_ST6;
  longdouble lVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  uint uVar34;
  vector<double,_std::allocator<double>_> f_args;
  allocator_type local_91;
  unsigned_long local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_70;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_68;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_60;
  long local_58;
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  double local_40;
  ulong local_38;
  
  local_50 = arg_vals;
  if ((char)in_FS_OFFSET[-10] == '\0') {
    eval_ast();
  }
  if ((char)in_FS_OFFSET[-6] == '\0') {
    eval_ast();
  }
  if ((char)in_FS_OFFSET[-2] == '\0') {
    eval_ast();
  }
  local_58 = in_FS_OFFSET[-0x16];
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)(*in_FS_OFFSET + -0x68),
             local_58 +
             ((long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(ast->
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  pAVar23 = (ast->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  pAVar5 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_90 = (long)pAVar23 - (long)pAVar5 >> 4;
  if (pAVar23 != pAVar5) {
    local_60 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(*in_FS_OFFSET + -0x28);
    local_68 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(*in_FS_OFFSET + -0x48);
    bVar10 = false;
    do {
      local_90 = local_90 - 1;
      pAVar23 = (ast->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      uVar34 = pAVar23[local_90].opcode;
      ppVar16 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                 *)(ulong)uVar34;
      if ((int)uVar34 < 0x50) {
        if (0x1f < (int)uVar34) {
          if ((int)uVar34 < 0x31) {
            if (uVar34 == 0x20) {
              lVar18 = in_FS_OFFSET[-0x16];
              lVar15 = in_FS_OFFSET[-0xd];
              lVar19 = lVar18 + -1;
              dVar8 = *(double *)(lVar15 + lVar18 * 8) + *(double *)(lVar15 + -8 + lVar18 * 8);
            }
            else if (uVar34 == 0x21) {
              lVar18 = in_FS_OFFSET[-0x16];
              lVar15 = in_FS_OFFSET[-0xd];
              lVar19 = lVar18 + -1;
              dVar8 = *(double *)(lVar15 + lVar18 * 8) - *(double *)(lVar15 + -8 + lVar18 * 8);
            }
            else {
              if (uVar34 != 0x30) goto switchD_0011273d_caseD_4;
              lVar18 = in_FS_OFFSET[-0x16];
              lVar15 = in_FS_OFFSET[-0xd];
              lVar19 = lVar18 + -1;
              dVar8 = *(double *)(lVar15 + lVar18 * 8) * *(double *)(lVar15 + -8 + lVar18 * 8);
            }
            goto LAB_00112e9e;
          }
          if ((int)uVar34 < 0x40) {
            if (uVar34 == 0x31) {
              lVar18 = in_FS_OFFSET[-0x16];
              lVar15 = in_FS_OFFSET[-0xd];
              lVar19 = lVar18 + -1;
              dVar8 = *(double *)(lVar15 + lVar18 * 8) / *(double *)(lVar15 + -8 + lVar18 * 8);
              goto LAB_00112e9e;
            }
            if (uVar34 == 0x32) {
              dVar8 = fmod(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                           *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              uVar32 = SUB84(dVar8,0);
              uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
              goto LAB_001135b6;
            }
          }
          else {
            if (uVar34 == 0x40) {
              dVar8 = pow(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                          *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              uVar32 = SUB84(dVar8,0);
              uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
              goto LAB_001135b6;
            }
            if (uVar34 == 0x41) {
              local_70 = log(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
              dVar8 = log(*(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8));
              goto LAB_0011362e;
            }
          }
          goto switchD_0011273d_caseD_4;
        }
        switch(uVar34) {
        case 0:
          lVar18 = in_FS_OFFSET[-0x16];
          in_FS_OFFSET[-0x16] = lVar18 + 1;
          *(undefined8 *)(in_FS_OFFSET[-0xd] + 8 + lVar18 * 8) = 0x7ff8000000000000;
          break;
        case 1:
          uVar32 = (undefined4)pAVar23[local_90].field_1.ref;
          uVar33 = (undefined4)(pAVar23[local_90].field_1.ref >> 0x20);
          goto LAB_00112a72;
        case 2:
          uVar11 = pAVar23[local_90].field_1.ref;
          pdVar14 = (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00112a6d;
        case 3:
          uVar11 = pAVar23[local_90].field_1.ref;
          pdVar14 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
LAB_00112a6d:
          uVar32 = SUB84(pdVar14[uVar11],0);
          uVar33 = (undefined4)((ulong)pdVar14[uVar11] >> 0x20);
LAB_00112a72:
          lVar18 = in_FS_OFFSET[-0x16];
          in_FS_OFFSET[-0x16] = lVar18 + 1;
          *(ulong *)(in_FS_OFFSET[-0xd] + 8 + lVar18 * 8) = CONCAT44(uVar33,uVar32);
          break;
        case 8:
          local_90 = *(long *)(in_FS_OFFSET[-4] + -8) + 1;
          in_FS_OFFSET[-4] = in_FS_OFFSET[-4] + -8;
          bVar10 = true;
          goto LAB_00113854;
        case 9:
          iVar7._M_current = (unsigned_long *)in_FS_OFFSET[-8];
          if (iVar7._M_current == (unsigned_long *)in_FS_OFFSET[-7]) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_68,iVar7,&local_90);
            pAVar23 = (ast->
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *iVar7._M_current = local_90;
            in_FS_OFFSET[-8] = (long)(iVar7._M_current + 1);
          }
          local_90 = local_90 - pAVar23[local_90].field_1.ref;
          goto LAB_00113854;
        case 0xc:
          uVar34 = pAVar23[local_90].field_1.call_info[0];
          uVar31 = (ulong)pAVar23[local_90].field_1.call_info[1];
          pUVar6 = (env->funcs).
                   super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<double,_std::allocator<double>_>::vector(&local_88,uVar31,&local_91);
          if (uVar31 != 0) {
            lVar18 = in_FS_OFFSET[-0x16];
            pdVar17 = (double *)(lVar18 * 8 + in_FS_OFFSET[-0xd]);
            uVar21 = 0;
            do {
              local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar21] = *pdVar17;
              uVar21 = uVar21 + 1;
              pdVar17 = pdVar17 + -1;
            } while (uVar31 != uVar21);
            in_FS_OFFSET[-0x16] = lVar18 - uVar21;
          }
          if ((pUVar6[uVar34].n_args == uVar31) &&
             ((ulong)in_FS_OFFSET[-1] < 0x101 &&
              *(pointer *)
               &pUVar6[uVar34].expr.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl !=
              (ast->
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
              _M_impl.super__Vector_impl_data._M_start)) {
            in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + 1;
            eval_ast(env,&pUVar6[uVar34].expr.ast,&local_88);
            in_FS_OFFSET[-1] = in_FS_OFFSET[-1] + -1;
            lVar18 = in_FS_OFFSET[-0x16] + 1;
            bVar9 = true;
          }
          else {
            bVar9 = false;
            lVar18 = local_58;
          }
          in_FS_OFFSET[-0x16] = lVar18;
          if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar9) {
            uVar32 = 0;
            uVar33 = 0x7ff80000;
            goto LAB_001138ea;
          }
          break;
        case 0x10:
          if (bVar10) {
            lVar18 = in_FS_OFFSET[-0x16];
            in_FS_OFFSET[-0x16] = lVar18 + -1;
            *(undefined8 *)(in_FS_OFFSET[-0xd] + -8 + lVar18 * 8) =
                 *(undefined8 *)(in_FS_OFFSET[-0xd] + lVar18 * 8);
            bVar10 = false;
          }
          else {
            iVar7._M_current = (unsigned_long *)in_FS_OFFSET[-4];
            if (iVar7._M_current == (unsigned_long *)in_FS_OFFSET[-3]) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(local_60,iVar7,&local_90);
            }
            else {
              *iVar7._M_current = local_90;
              in_FS_OFFSET[-4] = (long)(iVar7._M_current + 1);
            }
            local_90 = *(unsigned_long *)
                        (in_FS_OFFSET[-8] + -8 +
                        (ulong)(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) == 0.0) *
                        -8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,
                       (in_FS_OFFSET[-8] - in_FS_OFFSET[-9] >> 3) - 2);
          }
          break;
        case 0x11:
        case 0x12:
          lVar18 = in_FS_OFFSET[-0x16];
          if (bVar10) {
            lVar15 = lVar18 + -1;
            in_FS_OFFSET[-0x16] = lVar15;
            lVar19 = in_FS_OFFSET[-0xd];
            dVar8 = *(double *)(lVar19 + -0x18 + lVar18 * 8);
            dVar3 = *(double *)(lVar19 + lVar18 * 8);
            if (uVar34 == 0x12) {
              dVar3 = dVar3 * dVar8;
            }
            else {
              dVar3 = dVar3 + dVar8;
            }
            *(double *)(lVar19 + -0x18 + lVar18 * 8) = dVar3;
            bVar10 = false;
          }
          else {
            lVar15 = lVar18 + 1;
            in_FS_OFFSET[-0x16] = lVar15;
            lVar19 = in_FS_OFFSET[-0xd];
            puVar2 = (undefined8 *)(lVar19 + -8 + lVar18 * 8);
            uVar4 = puVar2[1];
            puVar1 = (undefined8 *)(lVar19 + lVar18 * 8);
            *puVar1 = *puVar2;
            puVar1[1] = uVar4;
            uVar22 = 0x3ff00000;
            if (uVar34 != 0x12) {
              uVar22 = 0;
            }
            *(ulong *)(lVar19 + -8 + lVar18 * 8) = (ulong)uVar22 << 0x20;
          }
          dVar8 = *(double *)(lVar19 + lVar15 * 8);
          if (NAN(dVar8)) {
            in_FS_OFFSET[-0x16] = lVar15 + -2;
            in_FS_OFFSET[-8] = in_FS_OFFSET[-8] + -8;
            break;
          }
          lVar18 = (long)dVar8;
          lVar24 = (long)*(double *)(lVar19 + -8 + lVar15 * 8);
          (env->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[pAVar23[local_90].field_1.ref] = (double)lVar18;
          dVar8 = NAN;
          if (lVar18 != lVar24) {
            dVar8 = (double)(long)(lVar18 + (ulong)(lVar18 <= lVar24) * 2 + -1);
          }
          *(double *)(lVar19 + lVar15 * 8) = dVar8;
          iVar7._M_current = (unsigned_long *)in_FS_OFFSET[-4];
          if (iVar7._M_current == (unsigned_long *)in_FS_OFFSET[-3]) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_60,iVar7,&local_90);
          }
          else {
            *iVar7._M_current = local_90;
            in_FS_OFFSET[-4] = (long)(iVar7._M_current + 1);
          }
          local_90 = *(unsigned_long *)(in_FS_OFFSET[-8] + -8);
          goto LAB_00113854;
        case 0x18:
          in_FS_OFFSET[-0x16] = in_FS_OFFSET[-0x16] + -1;
        }
      }
      else {
        lVar25 = in_ST1;
        lVar26 = in_ST2;
        lVar27 = in_ST3;
        lVar28 = in_ST4;
        lVar29 = in_ST5;
        lVar30 = in_ST6;
        switch(uVar34) {
        case 0x8000:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          uVar4 = *(undefined8 *)(lVar15 + lVar18 * 8);
          uVar34 = (uint)((ulong)uVar4 >> 0x20) ^ 0x80000000;
          uVar32 = (undefined4)uVar4;
          goto LAB_0011315c;
        case 0x8001:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          uVar34 = (uint)(-(ulong)(*(double *)(lVar15 + lVar18 * 8) == 0.0) >> 0x20) & 0x3ff00000;
          uVar32 = 0;
          goto LAB_0011315c;
        case 0x8002:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          uVar31 = *(ulong *)(lVar15 + lVar18 * 8) & 0x7fffffffffffffff;
          uVar32 = (undefined4)uVar31;
          uVar34 = (uint)(uVar31 >> 0x20);
LAB_0011315c:
          *(ulong *)(lVar15 + lVar18 * 8) = CONCAT44(uVar34,uVar32);
          goto switchD_0011273d_caseD_4;
        case 0x8003:
          dVar8 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
            lVar25 = in_ST1;
            lVar26 = in_ST2;
            lVar27 = in_ST3;
            lVar28 = in_ST4;
            lVar29 = in_ST5;
            lVar30 = in_ST6;
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          break;
        case 0x8004:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          dVar8 = *(double *)(lVar15 + lVar18 * 8);
          dVar8 = dVar8 * dVar8;
          goto LAB_0011384a;
        case 0x8005:
          dVar8 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          uVar31 = -(ulong)(0.0 < dVar8);
          *(ulong *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) =
               uVar31 & 0x3ff0000000000000 |
               (ulong)(~(uint)(uVar31 >> 0x20) & (uint)(-(ulong)(dVar8 != 0.0) >> 0x20) & 0xbff00000
                      ) << 0x20;
          goto switchD_0011273d_caseD_4;
        case 0x8006:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          dVar8 = floor(*(double *)(lVar15 + lVar18 * 8));
          uVar32 = SUB84(dVar8,0);
          uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
          goto LAB_00113343;
        case 0x8007:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          dVar8 = ceil(*(double *)(lVar15 + lVar18 * 8));
          uVar32 = SUB84(dVar8,0);
          uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
          goto LAB_00113343;
        case 0x8008:
          lVar18 = in_FS_OFFSET[-0x16];
          lVar15 = in_FS_OFFSET[-0xd];
          dVar8 = round(*(double *)(lVar15 + lVar18 * 8));
          uVar32 = SUB84(dVar8,0);
          uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
LAB_00113343:
          *(ulong *)(lVar15 + lVar18 * 8) = CONCAT44(uVar33,uVar32);
          goto switchD_0011273d_caseD_4;
        case 0x8009:
          dVar8 = exp(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x800a:
          dVar8 = exp2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x800b:
          dVar8 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
LAB_001131a2:
          dVar8 = log(dVar8);
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x800c:
          dVar8 = log10(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x800d:
          dVar8 = log2(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x800e:
          uVar32 = 0;
          uVar33 = 0;
          dVar8 = *(double *)((lanczos17m64 *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          if (0.0 <= dVar8) {
            uVar32 = SUB84(dVar8,0);
            uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
          }
          uVar34 = (uint)(long)(double)CONCAT44(uVar33,uVar32);
          if (uVar34 < 0xab) {
            dVar8 = (double)*(longdouble *)
                             (&DAT_001222f0 +
                             ((long)(double)CONCAT44(uVar33,uVar32) & 0xffffffffU) * 0x10);
            local_48 = dVar8;
          }
          else {
            local_38 = (ulong)(uVar34 + 1);
            boost::math::detail::
            gamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                      ((longdouble *)&local_88,(detail *)&local_91,(longdouble)local_38,ppVar16,
                       (lanczos17m64 *)in_FS_OFFSET[-0xd]);
            dVar8 = (double)in_ST0;
            in_ST0 = in_ST1;
            lVar25 = in_ST2;
            lVar26 = in_ST3;
            lVar27 = in_ST4;
            lVar28 = in_ST5;
            lVar29 = in_ST6;
            local_40 = dVar8;
            if (dVar8 <= 1.79769313486232e+308) {
              dVar8 = floor(dVar8 + 0.5);
              in_ST0 = in_ST1;
              lVar25 = in_ST2;
              lVar26 = in_ST3;
              lVar27 = in_ST4;
              lVar28 = in_ST5;
              lVar29 = in_ST6;
            }
          }
          break;
        case 0x800f:
          dVar8 = sin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8010:
          dVar8 = cos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8011:
          dVar8 = tan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8012:
          dVar8 = asin(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8013:
          dVar8 = acos(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8014:
          dVar8 = atan(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8015:
          dVar8 = sinh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8016:
          dVar8 = cosh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8017:
          dVar8 = tanh(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8018:
          dVar8 = tgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x8019:
          dVar8 = lgamma(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x801a:
          lVar26 = in_ST6;
          boost::math::detail::
          digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,(detail *)&local_88,
                     (longdouble)
                     *(double *)
                      ((policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                     (integral_constant<int,_53> *)ppVar16,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)in_FS_OFFSET[-0xd]);
          lVar25 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = lVar26;
          goto LAB_00113503;
        case 0x801b:
          lVar26 = in_ST6;
          boost::math::detail::
          trigamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,(detail *)&local_88,
                     (longdouble)
                     *(double *)
                      ((policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                     (integral_constant<int,_53> *)ppVar16,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)in_FS_OFFSET[-0xd]);
          lVar25 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = lVar26;
          goto LAB_00113503;
        case 0x801c:
          dVar8 = erf(*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        case 0x801d:
          lVar25 = (longdouble)
                   *(double *)
                    ((integral_constant<int,_53> *)in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          lVar26 = in_ST5;
          in_ST6 = in_ST5;
          boost::math::detail::
          zeta_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::integral_constant<int,53>>
                    ((longdouble *)&local_88,(detail *)&local_91,lVar25,(longdouble)1 - lVar25,
                     ppVar16,(integral_constant<int,_53> *)in_FS_OFFSET[-0xd]);
          lVar25 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar26;
LAB_00113503:
          *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) = (double)lVar25;
          goto switchD_0011273d_caseD_4;
        case 0x801e:
          dVar8 = exp(-*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8));
          *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) = 1.0 / (dVar8 + 1.0);
          goto switchD_0011273d_caseD_4;
        case 0x801f:
          dVar8 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          if (dVar8 < 15.0) {
            dVar8 = exp(dVar8);
            dVar8 = dVar8 + 1.0;
            goto LAB_001131a2;
          }
          goto switchD_0011273d_caseD_4;
        case 0x8020:
          dVar8 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
          dVar8 = exp(dVar8 * dVar8 * -0.5);
          dVar8 = dVar8 * 0.3989422804014327;
          lVar25 = in_ST1;
          lVar26 = in_ST2;
          lVar27 = in_ST3;
          lVar28 = in_ST4;
          lVar29 = in_ST5;
          lVar30 = in_ST6;
          break;
        default:
          switch(uVar34) {
          case 0x50:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            lVar19 = lVar18 + -1;
            dVar8 = *(double *)(lVar15 + -8 + lVar18 * 8);
            uVar32 = SUB84(dVar8,0);
            uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
            dVar3 = *(double *)(lVar15 + lVar18 * 8);
            if (dVar8 <= dVar3) {
              uVar32 = SUB84(dVar3,0);
              uVar33 = (undefined4)((ulong)dVar3 >> 0x20);
            }
            dVar8 = (double)CONCAT44(uVar33,uVar32);
            goto LAB_00112e9e;
          case 0x51:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            lVar19 = lVar18 + -1;
            dVar8 = *(double *)(lVar15 + -8 + lVar18 * 8);
            dVar3 = *(double *)(lVar15 + lVar18 * 8);
            if (dVar3 <= dVar8) {
              dVar8 = dVar3;
            }
            goto LAB_00112e9e;
          case 0x52:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            dVar3 = *(double *)(lVar15 + lVar18 * 8);
            dVar8 = 0.0;
            if ((dVar3 != 0.0) || (NAN(dVar3))) {
LAB_00112e1a:
              dVar8 = (double)(-(ulong)(*(double *)(lVar15 + -8 + lVar18 * 8) != 0.0) &
                              0x3ff0000000000000);
            }
            goto LAB_001135ce;
          case 0x53:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            dVar3 = *(double *)(lVar15 + lVar18 * 8);
            dVar8 = 1.0;
            if ((dVar3 == 0.0) && (dVar8 = 1.0, !NAN(dVar3))) goto LAB_00112e1a;
            goto LAB_001135ce;
          case 0x54:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            lVar19 = lVar18 + -1;
            dVar8 = (double)((*(double *)(lVar15 + -8 + lVar18 * 8) != 0.0) !=
                            (*(double *)(lVar15 + lVar18 * 8) != 0.0));
LAB_00112e9e:
            *(double *)(lVar15 + -8 + lVar18 * 8) = dVar8;
            goto LAB_00112efa;
          case 0x55:
          case 0x56:
          case 0x57:
          case 0x58:
          case 0x59:
          case 0x5a:
          case 0x5b:
          case 0x5c:
          case 0x5d:
          case 0x5e:
          case 0x5f:
            goto switchD_0011273d_caseD_4;
          case 0x60:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + lVar18 * 8) <
                             *(double *)(lVar15 + -8 + lVar18 * 8));
            break;
          case 0x61:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + lVar18 * 8) <=
                             *(double *)(lVar15 + -8 + lVar18 * 8));
            break;
          case 0x62:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + -8 + lVar18 * 8) ==
                             *(double *)(lVar15 + lVar18 * 8));
            break;
          case 99:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + -8 + lVar18 * 8) !=
                             *(double *)(lVar15 + lVar18 * 8));
            break;
          case 100:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + -8 + lVar18 * 8) <=
                             *(double *)(lVar15 + lVar18 * 8));
            break;
          case 0x65:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
            uVar31 = -(ulong)(*(double *)(lVar15 + -8 + lVar18 * 8) <
                             *(double *)(lVar15 + lVar18 * 8));
            break;
          default:
            t = (lanczos17m64 *)(ulong)(uVar34 - 0x4000);
            switch(t) {
            case (lanczos17m64 *)0x0:
              uVar20 = (unsigned_long)*(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
              uVar12 = (unsigned_long)*(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8)
              ;
              uVar13 = -uVar20;
              if (0 < (long)uVar20) {
                uVar13 = uVar20;
              }
              uVar20 = -uVar12;
              if (0 < (long)uVar12) {
                uVar20 = uVar12;
              }
              uVar13 = std::__detail::__gcd<unsigned_long>(uVar13,uVar20);
              dVar8 = (double)(long)uVar13;
              goto LAB_001135bc;
            case (lanczos17m64 *)0x1:
              local_70 = *(double *)(in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8);
              uVar20 = (unsigned_long)local_70;
              dVar8 = *(double *)(in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8);
              local_70 = local_70 * dVar8;
              uVar12 = (unsigned_long)dVar8;
              uVar13 = -uVar20;
              if (0 < (long)uVar20) {
                uVar13 = uVar20;
              }
              uVar20 = -uVar12;
              if (0 < (long)uVar12) {
                uVar20 = uVar12;
              }
              uVar13 = std::__detail::__gcd<unsigned_long>(uVar13,uVar20);
              dVar8 = (double)(long)uVar13;
LAB_0011362e:
              lVar18 = in_FS_OFFSET[-0x16];
              *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar18 * 8) = local_70 / dVar8;
              goto LAB_00113650;
            case (lanczos17m64 *)0x2:
              dVar8 = boost::math::
                      binomial_coefficient<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                                ((uint)(long)*(double *)
                                              (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8),
                                 (uint)(long)*(double *)
                                              (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                                 (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                  *)&local_88);
              uVar32 = SUB84(dVar8,0);
              uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
              break;
            case (lanczos17m64 *)0x3:
              dVar8 = boost::math::detail::
                      falling_factorial_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                                ((double)((long)*(double *)
                                                 (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                         0xffffffff),
                                 (uint)(long)*(double *)
                                              (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                                 (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                  *)&local_88);
              uVar32 = SUB84(dVar8,0);
              uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
              break;
            case (lanczos17m64 *)0x4:
              dVar8 = boost::math::detail::
                      rising_factorial_imp<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                                ((double)((long)*(double *)
                                                 (in_FS_OFFSET[-0xd] + in_FS_OFFSET[-0x16] * 8) &
                                         0xffffffff),
                                 (int)(long)*(double *)
                                             (in_FS_OFFSET[-0xd] + -8 + in_FS_OFFSET[-0x16] * 8),
                                 (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                                  *)&local_88);
              uVar32 = SUB84(dVar8,0);
              uVar33 = (undefined4)((ulong)dVar8 >> 0x20);
              break;
            case (lanczos17m64 *)0x5:
              ppVar16 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                         *)in_FS_OFFSET[-0xd];
              lVar25 = in_ST5;
              in_ST6 = in_ST5;
              boost::math::detail::
              beta_imp<long_double,boost::math::lanczos::lanczos17m64,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)&local_88,(detail *)&local_91,
                         (longdouble)*(double *)(ppVar16 + in_FS_OFFSET[-0x16] * 8),
                         (longdouble)*(double *)(ppVar16 + in_FS_OFFSET[-0x16] * 8 + -8),t,ppVar16);
              lVar18 = in_FS_OFFSET[-0x16];
              *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar18 * 8) = (double)in_ST0;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
              in_ST5 = lVar25;
              goto LAB_00113650;
            case (lanczos17m64 *)0x6:
              ppVar16 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                         *)in_FS_OFFSET[-0xd];
              uVar22 = (uint)*(double *)(ppVar16 + in_FS_OFFSET[-0x16] * 8);
              lVar25 = (longdouble)*(double *)(ppVar16 + in_FS_OFFSET[-0x16] * 8 + -8);
              if (uVar22 == 1) {
                lVar26 = in_ST6;
                boost::math::detail::
                trigamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                          ((longdouble *)0x0,(detail *)&local_88,lVar25,
                           (integral_constant<int,_53> *)t,ppVar16);
                lVar25 = in_ST0;
                in_ST0 = in_ST1;
                in_ST1 = in_ST2;
                in_ST2 = in_ST3;
                in_ST3 = in_ST4;
                in_ST4 = in_ST5;
                in_ST5 = in_ST6;
                in_ST6 = lVar26;
              }
              else if (uVar22 == 0) {
                lVar26 = in_ST6;
                boost::math::detail::
                digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                          ((longdouble *)0x0,(detail *)&local_88,lVar25,
                           (integral_constant<int,_53> *)t,ppVar16);
                lVar25 = in_ST0;
                in_ST0 = in_ST1;
                in_ST1 = in_ST2;
                in_ST2 = in_ST3;
                in_ST3 = in_ST4;
                in_ST4 = in_ST5;
                in_ST5 = in_ST6;
                in_ST6 = lVar26;
              }
              else {
                lVar26 = in_ST6;
                boost::math::detail::
                polygamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                          ((longdouble *)(ulong)uVar22,(detail *)&local_88,uVar34 - 0x4000,lVar25,
                           ppVar16);
                lVar25 = in_ST0;
                in_ST0 = in_ST1;
                in_ST1 = in_ST2;
                in_ST2 = in_ST3;
                in_ST3 = in_ST4;
                in_ST4 = in_ST5;
                in_ST5 = in_ST6;
                in_ST6 = lVar26;
              }
              lVar18 = in_FS_OFFSET[-0x16];
              *(double *)(in_FS_OFFSET[-0xd] + -8 + lVar18 * 8) = (double)lVar25;
              in_FS_OFFSET[-0x16] = lVar18 + -1;
            default:
              goto switchD_0011273d_caseD_4;
            }
LAB_001135b6:
            dVar8 = (double)CONCAT44(uVar33,uVar32);
LAB_001135bc:
            lVar18 = in_FS_OFFSET[-0x16];
            lVar15 = in_FS_OFFSET[-0xd];
LAB_001135ce:
            *(double *)(lVar15 + -8 + lVar18 * 8) = dVar8;
LAB_00113650:
            in_FS_OFFSET[-0x16] = lVar18 + -1;
            goto switchD_0011273d_caseD_4;
          }
          lVar19 = lVar18 + -1;
          *(ulong *)(lVar15 + -8 + lVar18 * 8) = uVar31 & 0x3ff0000000000000;
LAB_00112efa:
          in_FS_OFFSET[-0x16] = lVar19;
          goto switchD_0011273d_caseD_4;
        }
        lVar18 = in_FS_OFFSET[-0x16];
        lVar15 = in_FS_OFFSET[-0xd];
        in_ST1 = lVar25;
        in_ST2 = lVar26;
        in_ST3 = lVar27;
        in_ST4 = lVar28;
        in_ST5 = lVar29;
        in_ST6 = lVar30;
LAB_0011384a:
        *(double *)(lVar15 + lVar18 * 8) = dVar8;
      }
switchD_0011273d_caseD_4:
LAB_00113854:
    } while (local_90 != 0);
  }
  lVar18 = in_FS_OFFSET[-0x16];
  in_FS_OFFSET[-0x16] = lVar18 + -1;
  uVar4 = *(undefined8 *)(in_FS_OFFSET[-0xd] + lVar18 * 8);
  uVar32 = (undefined4)uVar4;
  uVar33 = (undefined4)((ulong)uVar4 >> 0x20);
LAB_001138ea:
  return (double)CONCAT44(uVar33,uVar32);
}

Assistant:

double eval_ast(Environment& env, const Expr::AST& ast,
        const std::vector<double>& arg_vals) {
    // Main AST evaluation stack
    thread_local std::vector<double> stk;
    // Stack of thunks available:
    // contains positions of thunk_jmp encountered
    thread_local std::vector<size_t> thunks;
    // Thunk call stack: contains positions to return to
    // after reaching thunk_ret
    thread_local std::vector<size_t> thunks_stk;

    // Max function call stack height
    static const size_t MAX_CALL_STK_HEIGHT = 256;
    // Curr function call stack height
    thread_local size_t call_stk_height = 0;

    thread_local size_t top = -1;
    size_t init_top = top;

    // Make sure there is enough space
    stk.resize(top + ast.size() + 1);

#ifdef ENABLE_NIVALIS_BOOST_MATH
    using namespace boost;
    using namespace boost::math;
#endif
    using namespace nivalis::OpCode;

    bool _is_thunk_ret = false;

    // Shorthands for first, 2nd, 3rd arguments to operator
#define ARG3 stk[top-2]
#define ARG2 stk[top-1]
#define ARG1 stk[top]
// Return value from thunk or func call
#define RET_VAL stk[top+1]
// Quit without messing up stack
#define FAIL_AND_QUIT do {top = init_top; return NONE; } while(0)

    for (size_t cidx = ast.size() - 1; ~cidx; --cidx) {
        const auto& node = ast[cidx];
        switch(node.opcode) {
            case null: stk[++top] = NONE; break;
            case val:
                stk[++top] = node.val;  break;
            case ref:
                stk[++top] = env.vars[node.ref]; break;
            case arg:
                stk[++top] = arg_vals[node.ref]; break;
            case thunk_jmp:
                thunks.push_back(cidx);
                cidx -= ast[cidx].ref;
                break;
            case thunk_ret:
                cidx = thunks_stk.back() + 1;
                thunks_stk.pop_back();
                _is_thunk_ret = true;
                break;
            case call:
                {
                    size_t n_args = node.call_info[1];
                    auto& func = env.funcs[node.call_info[0]];
                    std::vector<double> f_args(n_args);
                    for (size_t i = 0; i < n_args; ++i) {
                        f_args[i] = stk[top--];
                    }
                    if (n_args != func.n_args ||               // Should not happen
                        &func.expr.ast[0] == &ast[0] ||        // Disallow recursion
                        call_stk_height > MAX_CALL_STK_HEIGHT) // Too many nested calls
                            FAIL_AND_QUIT;
                    ++call_stk_height;
                    eval_ast(env, func.expr.ast, f_args);
                    --call_stk_height;
                    ++top;
                }
                break;
            case bnz:
                if (_is_thunk_ret) {
                    --top; _is_thunk_ret = false;
                    ARG1 = RET_VAL;
                } else {
                    thunks_stk.push_back(cidx);
                    cidx = thunks[thunks.size() - (ARG1 == 0.) - 1];
                    thunks.resize(thunks.size() - 2);
                }
                break;

            case sums: case prods:
                {
                    if (_is_thunk_ret) {
                        --top; _is_thunk_ret = false;
                        // update arg3 (the output)
                        if (node.opcode == prods)
                            ARG3 *= RET_VAL;
                        else
                            ARG3 += RET_VAL; // arg3 is output
                    } else {
                        // Move over the arguments and use arg3
                        // as output
                        ++top; ARG1 = ARG2; ARG2 = ARG3;
                        ARG3 = node.opcode == prods ? 1. : 0.;
                    }
                    uint64_t var_id = node.ref;
                    int64_t a = static_cast<int64_t>(ARG1),
                            b = static_cast<int64_t>(ARG2);
                    int64_t step = (a <= b) ? 1 : -1;
                    if (std::isnan(ARG1)) {
                        top -= 2; thunks.pop_back();
                    } else {
                        env.vars[var_id] = static_cast<double>(a);
                        a += step;
                        if (a == b + step) ARG1 = NONE;
                        else ARG1 = static_cast<double>(a);
                        thunks_stk.push_back(cidx);
                        cidx = thunks.back();
                    }
                }
                break;

            case bsel: --top; break;
            case add: ARG2 += ARG1; --top; break;
            case sub: ARG2 = ARG1 - ARG2; --top; break;
            case mul: ARG2 *= ARG1;  --top; break;
            case divi: ARG2 = ARG1 / ARG2; --top; break;
            case mod: ARG2 = std::fmod(ARG1, ARG2); --top; break;
            case power: ARG2 = std::pow(ARG1, ARG2); --top; break;
            case logbase: ARG2 = log(ARG1) / log(ARG2); --top; break;
            case max: ARG2 = std::max(ARG1, ARG2); --top; break;
            case min: ARG2 = std::min(ARG1, ARG2); --top; break;
            case land: ARG2 = static_cast<double>(ARG1 && ARG2); --top; break;
            case lor: ARG2 = static_cast<double>(ARG1 || ARG2); --top; break;
            case lxor: ARG2 = static_cast<double>(
                               (ARG1 != 0.) ^ (ARG2 != 0.)); --top; break;
            case gcd: ARG2 = static_cast<double>(
                              std::gcd((int64_t) ARG1,
                                       (int64_t) ARG2)); --top; break;
            case lcm: ARG2 = ARG1 * ARG2 /
                      static_cast<double>(std::gcd(
                          (int64_t) ARG1, (int64_t) ARG2)); --top; break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case choose: ARG2 = binomial_coefficient<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case fafact: ARG2 = falling_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case rifact: ARG2 = rising_factorial<double>(
                            (uint32_t)ARG1, (uint32_t)ARG2); --top; break;
            case betab: ARG2 = beta<double>(ARG1, ARG2); --top; break;
            case polygammab:
                        ARG2 = polygamma<double>((int)ARG1, ARG2); --top;
                        break;
#else
            case choose: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             b = std::min(b, a-b);
                             ARG2 = fa_fact(a, a-b) / fa_fact(b);
                             --top; break;
                         }
            case fafact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a, a-b);
                             --top; break;
                         }
            case rifact: {
                             double ad = std::round(ARG1);
                             double bd = std::round(ARG2);
                             if (ad < 0 || bd < 0) {
                                 ARG2 = std::numeric_limits<double>::quiet_NaN(); --top; break;
                             }
                             size_t a = static_cast<size_t>(ad), b = static_cast<size_t>(bd);
                             ARG2 = fa_fact(a+b-1, a-1);
                             --top; break;
                         }
            case betab: case polygammab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case lt: ARG2 = static_cast<double>(ARG1 < ARG2); --top; break;
            case le: ARG2 = static_cast<double>(ARG1 <= ARG2); --top; break;
            case eq: ARG2 = static_cast<double>(ARG1 == ARG2); --top; break;
            case ne: ARG2 = static_cast<double>(ARG1 != ARG2); --top; break;
            case ge: ARG2 = static_cast<double>(ARG1 >= ARG2); --top; break;
            case gt: ARG2 = static_cast<double>(ARG1 > ARG2); --top; break;

            case unaryminus: ARG1 = -ARG1; break;
            case lnot: ARG1 = static_cast<double>(!(ARG1)); break;
            case absb: ARG1 = std::fabs(ARG1); break;
            case sqrtb: ARG1 = std::sqrt(ARG1); break;
            case sqrb: ARG1 *= ARG1; break;
            case sgn: ARG1 = ARG1 > 0 ? 1 : (ARG1 == 0 ? 0 : -1); break;
            case floorb: ARG1 = floor(ARG1); break;
            case ceilb: ARG1 = ceil(ARG1); break; case roundb: ARG1 = round(ARG1); break;

            case expb:   ARG1 = exp(ARG1); break; case exp2b: ARG1 = exp2(ARG1); break;
            case logb:   ARG1 = log(ARG1); break;
            case factb:
                        {
                            unsigned n = static_cast<unsigned>(std::max(
                                        ARG1, 0.));
#ifdef ENABLE_NIVALIS_BOOST_MATH
                            ARG1 = factorial<double>(n);
#else
                            ARG1 = fa_fact(n, 1);
#endif
                        }
                        break;
            case log2b: ARG1 = log2(ARG1); break;  case log10b: ARG1 = log10(ARG1); break;
            case sinb: ARG1 = sin(ARG1); break;   case cosb:   ARG1 = cos(ARG1); break;
            case tanb: ARG1 = tan(ARG1); break;   case asinb: ARG1 = asin(ARG1); break;
            case acosb: ARG1 = acos(ARG1); break;  case atanb: ARG1 = atan(ARG1); break;
            case sinhb: ARG1 = sinh(ARG1); break;  case coshb: ARG1 = cosh(ARG1); break;
            case tanhb: ARG1 = tanh(ARG1); break;
            case tgammab: ARG1 = std::tgamma(ARG1); break;
            case lgammab: ARG1 = std::lgamma(ARG1); break;
#ifdef ENABLE_NIVALIS_BOOST_MATH
            case digammab: ARG1 = digamma<double>(ARG1); break;
            case trigammab: ARG1 = trigamma<double>(ARG1); break;
            case zetab: ARG1 = zeta<double>(ARG1); break;
#else
           // The following functions are unavailable without Boost
            case digammab: case trigammab: case zetab:
                ARG1 = NONE; print_boost_warning(node.opcode); break;
#endif
            case erfb: ARG1 = erf(ARG1); break;
            case sigmoidb: ARG1 = 1.f / (1.f + exp(-ARG1)); break;
            case softplusb: {
                                if (ARG1 < 15.f) {
                                    ARG1 = log(1.f + exp(ARG1));
                                }
                            }
                            break;
            case gausspdfb: ARG1 = 1.f / sqrt(M_PI * 2.f) * exp(-pow(ARG1, 2.f) * 0.5f); break;
        }
    }
    return stk[top--];
}